

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilbc_specific_functions.c
# Opt level: O2

void WebRtcSpl_ReverseOrderMultArrayElements
               (int16_t *out,int16_t *in,int16_t *win,size_t vector_length,int16_t right_shifts)

{
  short sVar1;
  int16_t *inptr;
  int16_t *outptr;
  size_t sVar2;
  
  for (sVar2 = 0; vector_length != sVar2; sVar2 = sVar2 + 1) {
    sVar1 = *win;
    win = win + -1;
    out[sVar2] = (int16_t)((int)sVar1 * (int)in[sVar2] >> ((byte)right_shifts & 0x1f));
  }
  return;
}

Assistant:

void WebRtcSpl_ReverseOrderMultArrayElements(int16_t *out, const int16_t *in,
                                             const int16_t *win,
                                             size_t vector_length,
                                             int16_t right_shifts)
{
    size_t i;
    int16_t *outptr = out;
    const int16_t *inptr = in;
    const int16_t *winptr = win;
    for (i = 0; i < vector_length; i++)
    {
      *outptr++ = (int16_t)((*inptr++ * *winptr--) >> right_shifts);
    }
}